

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

bool __thiscall duckdb::Node::HasByte(Node *this,ART *art,uint8_t *byte)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  ulong uVar3;
  NType NVar4;
  type paVar5;
  iterator iVar6;
  pointer pFVar7;
  data_ptr_t pdVar8;
  InternalException *this_00;
  ulong uVar9;
  NType value;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  string local_60;
  string local_40;
  
  uVar9 = (this->super_IndexPointer).data;
  NVar4 = (NType)(uVar9 >> 0x38);
  value = NVar4 & 0x7f;
  uVar11 = (uint)(uVar9 >> 0x20);
  if (value == NODE_256_LEAF) {
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar5->_M_elems[8].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_60._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar6 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_60);
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
    return (*(ulong *)(pdVar8 + (ulong)(*byte >> 6) * 8 +
                                (_Var1._M_head_impl)->bitmask_offset +
                                (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size + 8)
            >> ((ulong)*byte & 0x3f) & 1) != 0;
  }
  NVar4 = NVar4 & 0x7f;
  if (NVar4 == NODE_15_LEAF) {
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar5->_M_elems[7].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_60._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar6 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_60);
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,false);
    lVar12 = (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    uVar9 = (ulong)pdVar8[iVar2 + lVar12];
    if (uVar9 == 0) {
      return false;
    }
    if (pdVar8[iVar2 + lVar12 + 1] == *byte) {
      return true;
    }
    uVar3 = 1;
    do {
      uVar10 = uVar3;
      if (uVar9 == uVar10) break;
      uVar3 = uVar10 + 1;
    } while (pdVar8[uVar10 + iVar2 + lVar12 + 1] != *byte);
  }
  else {
    if (NVar4 != NODE_7_LEAF) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Invalid node type for GetNextByte: %s.","");
      EnumUtil::ToString<duckdb::NType>(&local_40,value);
      InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar5->_M_elems[6].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    local_60._M_dataplus._M_p = (pointer)(uVar9 & 0xffffffff);
    iVar6 = ::std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&((_Var1._M_head_impl)->buffers)._M_h,(key_type *)&local_60);
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)((long)iVar6.
                                    super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                    ._M_cur + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,false);
    lVar12 = (ulong)(uVar11 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    uVar9 = (ulong)pdVar8[iVar2 + lVar12];
    if (uVar9 == 0) {
      return false;
    }
    if (pdVar8[iVar2 + lVar12 + 1] == *byte) {
      return true;
    }
    uVar3 = 1;
    do {
      uVar10 = uVar3;
      if (uVar9 == uVar10) break;
      uVar3 = uVar10 + 1;
    } while (pdVar8[uVar10 + iVar2 + lVar12 + 1] != *byte);
  }
  return uVar10 < uVar9;
}

Assistant:

bool Node::HasByte(ART &art, uint8_t &byte) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_7_LEAF:
		return Ref<const Node7Leaf>(art, *this, NType::NODE_7_LEAF).HasByte(byte);
	case NType::NODE_15_LEAF:
		return Ref<const Node15Leaf>(art, *this, NType::NODE_15_LEAF).HasByte(byte);
	case NType::NODE_256_LEAF:
		return Ref<Node256Leaf>(art, *this, NType::NODE_256_LEAF).HasByte(byte);
	default:
		throw InternalException("Invalid node type for GetNextByte: %s.", EnumUtil::ToString(type));
	}
}